

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxOutputComponentsTest::~GeometryShaderMaxOutputComponentsTest
          (GeometryShaderMaxOutputComponentsTest *this)

{
  GeometryShaderMaxOutputComponentsTest *this_local;
  
  ~GeometryShaderMaxOutputComponentsTest(this);
  operator_delete(this,0x378);
  return;
}

Assistant:

virtual ~GeometryShaderMaxOutputComponentsTest()
	{
	}